

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> * __thiscall
CLI::App::get_options
          (vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *__return_storage_ptr__
          ,App *this,function<bool_(const_CLI::Option_*)> *filter)

{
  pointer this_00;
  bool bVar1;
  size_type __n;
  __shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *this_01;
  ulong uVar2;
  char *pcVar3;
  iterator __first;
  iterator __last;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_110;
  const_iterator local_108;
  function<bool_(const_CLI::Option_*)> local_100;
  undefined1 local_e0 [8];
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> subcopts;
  App *subc;
  shared_ptr<CLI::App> *subcp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_98;
  const_iterator local_90;
  function<bool_(const_CLI::Option_*)> *local_88;
  Option **local_80;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_78;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_70;
  const_iterator local_68;
  Option **local_60;
  Option **local_50;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_48;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_40;
  allocator<const_CLI::Option_*> local_22;
  undefined1 local_21;
  function<bool_(const_CLI::Option_*)> *local_20;
  function<bool_(const_CLI::Option_*)> *filter_local;
  App *this_local;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *options;
  
  local_21 = 0;
  local_20 = filter;
  filter_local = (function<bool_(const_CLI::Option_*)> *)this;
  this_local = (App *)__return_storage_ptr__;
  __n = std::
        vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ::size(&this->options_);
  std::allocator<const_CLI::Option_*>::allocator(&local_22);
  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
            (__return_storage_ptr__,__n,&local_22);
  std::allocator<const_CLI::Option_*>::~allocator(&local_22);
  local_40 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
             ::std::
             begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       (&this->options_);
  local_48 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
             ::std::
             end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       (&this->options_);
  local_50 = (Option **)
             ::std::begin<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                       (__return_storage_ptr__);
  local_60 = (Option **)
             ::std::
             transform<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,CLI::App::get_options(std::function<bool(CLI::Option_const*)>)const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                       (local_40,local_48,local_50);
  bVar1 = ::std::function::operator_cast_to_bool((function *)filter);
  if (bVar1) {
    local_78._M_current =
         (Option **)
         ::std::begin<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                   (__return_storage_ptr__);
    local_80 = (Option **)
               ::std::end<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                         (__return_storage_ptr__);
    local_88 = filter;
    local_70 = ::std::
               remove_if<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,CLI::App::get_options(std::function<bool(CLI::Option_const*)>)const::_lambda(CLI::Option_const*)_1_>
                         (local_78,(__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                                    )local_80,(anon_class_8_1_552cbcb6_for__M_pred)filter);
    __gnu_cxx::
    __normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
    ::__normal_iterator<CLI::Option_const**>
              ((__normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                *)&local_68,&local_70);
    local_98._M_current =
         (Option **)
         ::std::end<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                   (__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
    ::__normal_iterator<CLI::Option_const**>
              ((__normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                *)&local_90,&local_98);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::erase
              (__return_storage_ptr__,local_68,local_90);
  }
  __end1 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
           begin(&this->subcommands_);
  subcp = (shared_ptr<CLI::App> *)
          std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
                    (&this->subcommands_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                     *)&subcp), bVar1) {
    this_01 = &__gnu_cxx::
               __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
               ::operator*(&__end1)->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
    subcopts.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::get(this_01);
    get_name_abi_cxx11_((App *)subcopts.
                               super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      get_group_abi_cxx11_
                ((App *)subcopts.
                        super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar2 = ::std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        get_group_abi_cxx11_
                  ((App *)subcopts.
                          super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pcVar3 = (char *)::std::__cxx11::string::front();
        this_00 = subcopts.
                  super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (*pcVar3 == '+') {
          std::function<bool_(const_CLI::Option_*)>::function(&local_100,filter);
          get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_e0,
                      (App *)this_00,&local_100);
          std::function<bool_(const_CLI::Option_*)>::~function(&local_100);
          local_110._M_current =
               (Option **)
               std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end
                         (__return_storage_ptr__);
          __gnu_cxx::
          __normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
          ::__normal_iterator<CLI::Option_const**>
                    ((__normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                      *)&local_108,&local_110);
          __first = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::begin
                              ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                               local_e0);
          __last = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end
                             ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                              local_e0);
          ::std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>::
          insert<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,void>
                    ((vector<CLI::Option_const*,std::allocator<CLI::Option_const*>> *)
                     __return_storage_ptr__,local_108,
                     (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                      )__last._M_current);
          std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
                    ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_e0);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::vector<const Option *> App::get_options(const std::function<bool(const Option *)> filter) const {
    std::vector<const Option *> options(options_.size());
    std::transform(
        std::begin(options_), std::end(options_), std::begin(options), [](const Option_p &val) { return val.get(); });

    if(filter) {
        options.erase(std::remove_if(std::begin(options),
                                     std::end(options),
                                     [&filter](const Option *opt) { return !filter(opt); }),
                      std::end(options));
    }
    for(const auto &subcp : subcommands_) {
        // also check down into nameless subcommands
        const App *subc = subcp.get();
        if(subc->get_name().empty() && !subc->get_group().empty() && subc->get_group().front() == '+') {
            std::vector<const Option *> subcopts = subc->get_options(filter);
            options.insert(options.end(), subcopts.begin(), subcopts.end());
        }
    }
    return options;
}